

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

void Amap_ManMatchNode(Amap_Man_t *p,Amap_Obj_t *pNode,int fFlow,int fRefs)

{
  Amap_Cut_t *pAVar1;
  int iVar2;
  Amap_Cut_t AVar3;
  ulong uVar4;
  Amap_Gat_t *pAVar5;
  Amap_Obj_t *pAVar6;
  Amap_Cut_t **ppAVar7;
  Amap_Cut_t *pAVar8;
  uint uVar9;
  int iVar10;
  Amap_Set_t *pAVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Amap_Mat_t local_98;
  Amap_Cut_t *local_78;
  Amap_Set_t *pAStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  Amap_Cut_t *local_58;
  Amap_Set_t *pAStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  ulong local_38;
  
  pAStack_50 = (Amap_Set_t *)0x0;
  uStack_48._0_4_ = 0.0;
  uStack_48._4_4_ = 0.0;
  uStack_40._0_4_ = 0.0;
  uStack_40._4_4_ = 0;
  pAStack_70 = (Amap_Set_t *)0x0;
  uStack_68._0_4_ = 0.0;
  uStack_68._4_4_ = 0.0;
  uStack_60._0_4_ = 0.0;
  uStack_60._4_4_ = 0;
  if (fRefs == 0) {
    pNode->EstRefs = (float)pNode->nRefs;
  }
  else {
    iVar2 = pNode->nFouts[1] + pNode->nFouts[0];
    pNode->EstRefs = (pNode->EstRefs + pNode->EstRefs + (float)iVar2) / 3.0;
    if (0 < iVar2) {
      Amap_CutAreaDeref(p,&pNode->Best);
    }
  }
  local_78 = (Amap_Cut_t *)0x0;
  local_58 = (Amap_Cut_t *)0x0;
  pAVar8 = (Amap_Cut_t *)(pNode->field_11).pData;
  uVar4 = 0;
  do {
    if (*(uint *)&pNode->field_0x8 >> 0xc <= (uint)uVar4) {
      fVar16 = (float)uStack_48 - (float)uStack_68;
      fVar15 = -fVar16;
      if (-fVar16 <= fVar16) {
        fVar15 = fVar16;
      }
      fVar14 = (float)uStack_40 - (float)uStack_60;
      fVar16 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar16 = fVar14;
      }
      ppAVar7 = &local_58;
      if (fVar15 / (float)uStack_68 < (fVar16 * p->pPars->fADratio) / (float)uStack_40) {
        ppAVar7 = &local_78;
      }
      *(ulong *)pNode =
           *(ulong *)pNode & 0x7fffffffffffffff |
           (ulong)(((uint)ppAVar7[1][2] ^ (uint)**ppAVar7) >> 0x10) << 0x3f;
      pAVar11 = (Amap_Set_t *)ppAVar7[1];
      pAVar8 = ppAVar7[2];
      pAVar1 = ppAVar7[3];
      (pNode->Best).pCut = *ppAVar7;
      (pNode->Best).pSet = pAVar11;
      *(Amap_Cut_t **)&(pNode->Best).Area = pAVar8;
      *(Amap_Cut_t **)&(pNode->Best).Delay = pAVar1;
      pAVar8 = Amap_ManDupCut(p,(pNode->Best).pCut);
      (pNode->Best).pCut = pAVar8;
      if ((fRefs != 0) &&
         (iVar2 = pNode->nFouts[1] + pNode->nFouts[0],
         iVar2 != 0 && SCARRY4(pNode->nFouts[1],pNode->nFouts[0]) == iVar2 < 0)) {
        Amap_CutAreaRef(p,&pNode->Best);
        return;
      }
      return;
    }
    local_38 = uVar4;
    AVar3 = *pAVar8;
    uVar4 = (ulong)(uint)AVar3;
    if (((uint)AVar3 & 0xffff) != 0) {
      pAVar11 = (Amap_Set_t *)&p->pLib->pNodes[uVar4 & 0xffff].pSets;
LAB_0033a1c2:
      AVar3 = SUB84(uVar4,0);
      pAVar11 = pAVar11->pNext;
      if (pAVar11 != (Amap_Set_t *)0x0) {
        local_98.Area = 0.0;
        local_98.AveFan = 0.0;
        local_98.Delay = 0.0;
        local_98._28_4_ = 0;
        local_98.pCut = pAVar8;
        local_98.pSet = pAVar11;
        pAVar5 = Amap_LibGate(p->pLib,(uint)*(ushort *)&pAVar11->field_0x8);
        uVar4 = (ulong)(uint)*pAVar8;
        uVar9 = (uint)*pAVar8 >> 0x11;
        if (fFlow == 0) {
          if ((byte)pAVar5->field_0x3b != uVar9) {
            __assert_fail("pGate->nPins == pM->pCut->nFans",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                          ,0x1ad,
                          "void Amap_ManMatchGetExacts(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)");
          }
          fVar16 = 0.0;
          fVar15 = 0.0;
          for (uVar12 = 0; uVar12 < uVar4 >> 0x11; uVar12 = uVar12 + 1) {
            uVar9 = Abc_Lit2Var((int)pAVar11->Ins[uVar12]);
            iVar2 = Abc_Lit2Var((int)pAVar8[(ulong)uVar9 + 1]);
            pAVar6 = Amap_ManObj(p,iVar2);
            iVar10 = (int)(pAVar6->Best).Delay;
            iVar2 = (int)fVar16;
            if ((int)fVar16 <= iVar10) {
              iVar2 = iVar10;
            }
            fVar16 = (float)iVar2;
            fVar15 = fVar15 + (float)(pAVar6->nFouts[1] + pAVar6->nFouts[0]);
            uVar4 = (ulong)(uint)*pAVar8;
          }
          fVar15 = fVar15 / (float)(byte)pAVar5->field_0x3b;
          fVar16 = fVar16 + 1.0;
          local_98.Delay = fVar16;
          local_98.AveFan = fVar15;
          fVar14 = Amap_CutAreaRef(p,&local_98);
          fVar13 = Amap_CutAreaDeref(p,&local_98);
          if (fVar13 <= fVar14 - p->fEpsilonInternal) {
            __assert_fail("aResult > aResult2 - p->fEpsilonInternal",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                          ,0x14f,
                          "float Amap_CutAreaDerefed(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)");
          }
          if (fVar14 + p->fEpsilonInternal <= fVar13) {
            __assert_fail("aResult < aResult2 + p->fEpsilonInternal",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                          ,0x150,
                          "float Amap_CutAreaDerefed(Amap_Man_t *, Amap_Obj_t *, Amap_Mat_t *)");
          }
          uVar4 = (ulong)(uint)*pAVar8;
          uVar9 = (*(uint *)&pAVar11->field_0x8 ^ (uint)*pAVar8) >> 0x10 & 1;
          if ((pNode->nFouts[uVar9] == 0) && (0 < pNode->nFouts[uVar9 ^ 1])) {
            fVar13 = fVar13 + p->fAreaInv;
          }
          local_98.Area = fVar13;
        }
        else {
          if ((byte)pAVar5->field_0x3b != uVar9) {
            __assert_fail("pGate->nPins == pM->pCut->nFans",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/amap/amapMatch.c"
                          ,0x188,"void Amap_ManMatchGetFlows(Amap_Man_t *, Amap_Mat_t *)");
          }
          fVar13 = (float)pAVar5->dArea;
          fVar16 = 0.0;
          fVar15 = 0.0;
          for (uVar12 = 0; uVar12 < uVar4 >> 0x11; uVar12 = uVar12 + 1) {
            uVar9 = Abc_Lit2Var((int)pAVar11->Ins[uVar12]);
            iVar2 = Abc_Lit2Var((int)pAVar8[(ulong)uVar9 + 1]);
            pAVar6 = Amap_ManObj(p,iVar2);
            iVar2 = (int)(pAVar6->Best).Delay;
            if (iVar2 < (int)fVar16) {
              iVar2 = (int)fVar16;
            }
            fVar16 = (pAVar6->Best).Area;
            iVar10 = pAVar6->nFouts[1] + pAVar6->nFouts[0];
            if (iVar10 != 0) {
              fVar16 = fVar16 / pAVar6->EstRefs;
            }
            fVar13 = fVar13 + fVar16;
            fVar16 = (float)iVar2;
            fVar15 = fVar15 + (float)iVar10;
            uVar4 = (ulong)(uint)*pAVar8;
          }
          fVar15 = fVar15 / (float)(byte)pAVar5->field_0x3b;
          local_98.AveFan = fVar15;
          local_98.Area = fVar13;
          fVar16 = fVar16 + 1.0;
          local_98.Delay = fVar16;
        }
        if (local_78 == (Amap_Cut_t *)0x0) {
LAB_0033a437:
          uStack_68._0_4_ = local_98.Area;
          uStack_68._4_4_ = local_98.AveFan;
          uStack_60._0_4_ = local_98.Delay;
          uStack_60._4_4_ = local_98._28_4_;
          local_78 = local_98.pCut;
          pAStack_70 = local_98.pSet;
        }
        else {
          fVar14 = p->pPars->fEpsilon;
          if ((fVar16 - fVar14 <= (float)uStack_60) &&
             ((fVar16 + fVar14 < (float)uStack_60 ||
              ((fVar13 - fVar14 <= (float)uStack_68 &&
               ((fVar14 + fVar13 < (float)uStack_68 || (uStack_68._4_4_ <= fVar15 - fVar14))))))))
          goto LAB_0033a437;
        }
        if (local_58 != (Amap_Cut_t *)0x0) break;
        goto LAB_0033a47a;
      }
    }
    uVar4 = (ulong)((int)local_38 + 1);
    pAVar8 = pAVar8 + (ulong)((uint)AVar3 >> 0x11) + 1;
  } while( true );
  fVar14 = p->pPars->fEpsilon;
  if ((fVar13 - fVar14 <= (float)uStack_48) &&
     ((fVar13 + fVar14 < (float)uStack_48 ||
      ((uStack_48._4_4_ <= fVar15 - fVar14 &&
       ((uStack_48._4_4_ < fVar15 + fVar14 || (fVar16 - fVar14 <= (float)uStack_40)))))))) {
LAB_0033a47a:
    uStack_48._0_4_ = local_98.Area;
    uStack_48._4_4_ = local_98.AveFan;
    uStack_40._0_4_ = local_98.Delay;
    uStack_40._4_4_ = local_98._28_4_;
    local_58 = local_98.pCut;
    pAStack_50 = local_98.pSet;
  }
  goto LAB_0033a1c2;
}

Assistant:

void Amap_ManMatchNode( Amap_Man_t * p, Amap_Obj_t * pNode, int fFlow, int fRefs )
{
    int fVerbose = 0; //(pNode->Level == 2 || pNode->Level == 4);
    int fVeryVerbose = fVerbose;

    Amap_Mat_t MA = {0}, MD = {0}, M = {0};
    Amap_Mat_t * pMBestA = &MA, * pMBestD = &MD, * pMThis = &M, * pMBest;
    Amap_Cut_t * pCut;
    Amap_Set_t * pSet;
    Amap_Nod_t * pNod;
    int i;

    if ( fRefs )
        pNode->EstRefs = (float)((2.0 * pNode->EstRefs + Amap_ObjRefsTotal(pNode)) / 3.0);
    else
        pNode->EstRefs = (float)pNode->nRefs;
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaDeref( p, &pNode->Best );

    if ( fVerbose )
        printf( "\nNode %d (%d)\n", pNode->Id, pNode->Level );

    pMBestA->pCut = pMBestD->pCut = NULL;
    Amap_NodeForEachCut( pNode, pCut, i )
    {
        if ( pCut->iMat == 0 )
            continue;
        pNod = Amap_LibNod( p->pLib, pCut->iMat );
        Amap_LibNodeForEachSet( pNod, pSet )
        {
            Amap_ManMatchStart( pMThis, pCut, pSet );
            if ( fFlow )
                Amap_ManMatchGetFlows( p, pMThis );
            else
                Amap_ManMatchGetExacts( p, pNode, pMThis );
            if ( pMBestD->pCut == NULL || Amap_CutCompareDelay(p, pMBestD, pMThis) == 1 )
                *pMBestD = *pMThis;
            if ( pMBestA->pCut == NULL || Amap_CutCompareArea(p, pMBestA, pMThis) == 1 )
                *pMBestA = *pMThis;

            if ( fVeryVerbose ) 
            {
                printf( "Cut %2d (%d) :  ", i, pCut->nFans );
                printf( "Gate %10s  ",      Amap_LibGate(p->pLib, pMThis->pSet->iGate)->pName );
                printf( "%s  ",             pMThis->pSet->fInv ? "inv" : "   " );
                printf( "Delay %5.2f  ",    pMThis->Delay );
                printf( "Area %5.2f  ",     pMThis->Area );
                printf( "\n" );
            }
        }
    }

    if ( Abc_AbsFloat(pMBestA->Area - pMBestD->Area) / pMBestD->Area >= p->pPars->fADratio * Abc_AbsFloat(pMBestA->Delay - pMBestD->Delay) / pMBestA->Delay )
        pMBest = pMBestA;
    else
        pMBest = pMBestD;

    if ( fVerbose )
    {
        printf( "BEST MATCHA:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestA->pSet->iGate)->pName );
        printf( "%s  ",           pMBestA->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestA->Delay );
        printf( "Area %5.2f  ",   pMBestA->Area );
        printf( "\n" ); 

        printf( "BEST MATCHD:  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBestD->pSet->iGate)->pName );
        printf( "%s  ",           pMBestD->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBestD->Delay );
        printf( "Area %5.2f  ",   pMBestD->Area );
        printf( "\n" ); 

        printf( "BEST MATCH :  " );
        printf( "Gate %10s  ",    Amap_LibGate(p->pLib, pMBest->pSet->iGate)->pName );
        printf( "%s  ",           pMBest->pSet->fInv ? "inv" : "   " );
        printf( "Delay %5.2f  ",  pMBest->Delay );
        printf( "Area %5.2f  ",   pMBest->Area );
        printf( "\n" ); 
    }

    pNode->fPolar = pMBest->pCut->fInv ^ pMBest->pSet->fInv;
    pNode->Best = *pMBest;
    pNode->Best.pCut = Amap_ManDupCut( p, pNode->Best.pCut );
    if ( fRefs && Amap_ObjRefsTotal(pNode) > 0 )
        Amap_CutAreaRef( p, &pNode->Best );
}